

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O1

int ipc_ep_get_recv_max_sz(void *arg,void *v,size_t *szp,nni_type t)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)arg);
  iVar1 = nni_copyout_size(*(size_t *)((long)arg + 0x28),v,szp,t);
  nni_mtx_unlock((nni_mtx *)arg);
  return iVar1;
}

Assistant:

static int
ipc_ep_get_recv_max_sz(void *arg, void *v, size_t *szp, nni_type t)
{
	ipc_ep *ep = arg;
	int     rv;
	nni_mtx_lock(&ep->mtx);
	rv = nni_copyout_size(ep->rcv_max, v, szp, t);
	nni_mtx_unlock(&ep->mtx);
	return (rv);
}